

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool __thiscall
google::protobuf::Reflection::IsSingularFieldNonEmpty
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  byte bVar2;
  CppType CVar3;
  uint uVar4;
  CppStringType CVar5;
  LogMessage *pLVar6;
  bool *pbVar7;
  long *plVar8;
  uint *puVar9;
  unsigned_long *puVar10;
  float *source;
  double *source_00;
  unsigned_long uVar11;
  int *piVar12;
  Cord *this_00;
  InlinedStringField *this_01;
  MicroString *this_02;
  ArenaStringPtr *this_03;
  byte local_b1;
  string_view local_b0;
  byte local_99;
  LogMessage local_98;
  Voidify local_82;
  byte local_81;
  LogMessage local_80;
  Voidify local_6a;
  byte local_69;
  LogMessage local_68;
  Voidify local_55 [20];
  byte local_41;
  LogMessage local_40;
  Voidify local_29;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = anon_unknown_6::IsMapEntry(field);
  local_41 = 0;
  local_b1 = 1;
  if (!bVar1) {
    bVar1 = FieldDescriptor::has_presence(local_28);
    local_b1 = bVar1 ^ 0xff;
  }
  if (((local_b1 ^ 0xff) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xbf0,"IsMapEntry(field) || !field->has_presence()");
    local_41 = 1;
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar6);
  }
  if ((local_41 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  bVar1 = FieldDescriptor::is_repeated(local_28);
  local_69 = 0;
  if (bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xbf1,"!field->is_repeated()");
    local_69 = 1;
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_55,pLVar6);
  }
  if ((local_69 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  bVar1 = FieldDescriptor::is_map(local_28);
  local_81 = 0;
  if (bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xbf2,"!field->is_map()");
    local_81 = 1;
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_6a,pLVar6);
  }
  if ((local_81 & 1) == 0) {
    CVar3 = FieldDescriptor::cpp_type(local_28);
    local_99 = 0;
    if (CVar3 == CPPTYPE_MESSAGE) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0xbf3,"field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE");
      local_99 = 1;
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_82,pLVar6);
    }
    if ((local_99 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_98);
    }
    CVar3 = FieldDescriptor::cpp_type(local_28);
    switch(CVar3) {
    case CPPTYPE_INT32:
      piVar12 = GetRaw<int>(this,(Message *)field_local,local_28);
      this_local._7_1_ = *piVar12 != 0;
      break;
    case CPPTYPE_INT64:
      plVar8 = GetRaw<long>(this,(Message *)field_local,local_28);
      this_local._7_1_ = *plVar8 != 0;
      break;
    case CPPTYPE_UINT32:
      puVar9 = GetRaw<unsigned_int>(this,(Message *)field_local,local_28);
      this_local._7_1_ = *puVar9 != 0;
      break;
    case CPPTYPE_UINT64:
      puVar10 = GetRaw<unsigned_long>(this,(Message *)field_local,local_28);
      this_local._7_1_ = *puVar10 != 0;
      break;
    case CPPTYPE_DOUBLE:
      source_00 = GetRaw<double>(this,(Message *)field_local,local_28);
      uVar11 = absl::lts_20250127::bit_cast<unsigned_long,_double,_0>(source_00);
      this_local._7_1_ = uVar11 != 0;
      break;
    case CPPTYPE_FLOAT:
      source = GetRaw<float>(this,(Message *)field_local,local_28);
      uVar4 = absl::lts_20250127::bit_cast<unsigned_int,_float,_0>(source);
      this_local._7_1_ = uVar4 != 0;
      break;
    case CPPTYPE_BOOL:
      pbVar7 = GetRaw<bool>(this,(Message *)field_local,local_28);
      this_local._7_1_ = (*pbVar7 & 1U) != 0;
      break;
    case CPPTYPE_ENUM:
      piVar12 = GetRaw<int>(this,(Message *)field_local,local_28);
      this_local._7_1_ = *piVar12 != 0;
      break;
    case CPPTYPE_STRING:
      CVar5 = FieldDescriptor::cpp_string_type(local_28);
      if (CVar5 != kView) {
        if (CVar5 == kCord) {
          this_00 = GetField<absl::lts_20250127::Cord_const>(this,(Message *)field_local,local_28);
          bVar1 = absl::lts_20250127::Cord::empty(this_00);
          return (bool)((bVar1 ^ 0xffU) & 1);
        }
        if (CVar5 != kString) {
          internal::Unreachable
                    ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0xc20);
        }
      }
      bVar1 = IsInlined(this,local_28);
      if (bVar1) {
        this_01 = GetField<google::protobuf::internal::InlinedStringField>
                            (this,(Message *)field_local,local_28);
        internal::InlinedStringField::GetNoArena_abi_cxx11_(this_01);
        bVar2 = std::__cxx11::string::empty();
        this_local._7_1_ = (bool)((bVar2 ^ 0xff) & 1);
      }
      else {
        bVar1 = IsMicroString(this,local_28);
        if (bVar1) {
          this_02 = GetField<google::protobuf::internal::MicroString>
                              (this,(Message *)field_local,local_28);
          local_b0 = internal::MicroString::Get(this_02);
          bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_b0);
          this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
        }
        else {
          this_03 = GetField<google::protobuf::internal::ArenaStringPtr>
                              (this,(Message *)field_local,local_28);
          internal::ArenaStringPtr::Get_abi_cxx11_(this_03);
          bVar2 = std::__cxx11::string::empty();
          this_local._7_1_ = (bool)((bVar2 ^ 0xff) & 1);
        }
      }
      break;
    case CPPTYPE_MESSAGE:
    default:
      internal::Unreachable
                ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0xc24);
    }
    return this_local._7_1_;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_80);
}

Assistant:

bool Reflection::IsSingularFieldNonEmpty(const Message& message,
                                         const FieldDescriptor* field) const {
  ABSL_DCHECK(IsMapEntry(field) || !field->has_presence());
  ABSL_DCHECK(!field->is_repeated());
  ABSL_DCHECK(!field->is_map());
  ABSL_DCHECK(field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE);
  // Scalar primitive (numeric or string/bytes) fields are present if
  // their value is non-zero (numeric) or non-empty (string/bytes). N.B.:
  // we must use this definition here, rather than the "scalar fields
  // always present" in the proto3 docs, because MergeFrom() semantics
  // require presence as "present on wire", and reflection-based merge
  // (which uses HasField()) needs to be consistent with this.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return GetRaw<bool>(message, field) != false;
    case FieldDescriptor::CPPTYPE_INT32:
      return GetRaw<int32_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_INT64:
      return GetRaw<int64_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_UINT32:
      return GetRaw<uint32_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_UINT64:
      return GetRaw<uint64_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_FLOAT:
      static_assert(sizeof(uint32_t) == sizeof(float),
                    "Code assumes uint32_t and float are the same size.");
      return absl::bit_cast<uint32_t>(GetRaw<float>(message, field)) != 0;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      static_assert(sizeof(uint64_t) == sizeof(double),
                    "Code assumes uint64_t and double are the same size.");
      return absl::bit_cast<uint64_t>(GetRaw<double>(message, field)) != 0;
    case FieldDescriptor::CPPTYPE_ENUM:
      return GetRaw<int>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_STRING:
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kCord:
          return !GetField<const absl::Cord>(message, field).empty();
        case FieldDescriptor::CppStringType::kView:
        case FieldDescriptor::CppStringType::kString: {
          if (IsInlined(field)) {
            return !GetField<InlinedStringField>(message, field)
                        .GetNoArena()
                        .empty();
          } else if (IsMicroString(field)) {
            return !GetField<MicroString>(message, field).Get().empty();
          }

          return !GetField<ArenaStringPtr>(message, field).Get().empty();
        }
        default:
          internal::Unreachable();
      }
    case FieldDescriptor::CPPTYPE_MESSAGE:
    default:
      internal::Unreachable();
  }
}